

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O0

int mbedtls_ssl_tls12_write_client_hello_exts
              (mbedtls_ssl_context *ssl,uchar *buf,uchar *end,int uses_ec,size_t *out_len)

{
  size_t local_50;
  size_t ext_len;
  uchar *p;
  size_t *psStack_38;
  int ret;
  size_t *out_len_local;
  uchar *puStack_28;
  int uses_ec_local;
  uchar *end_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  p._4_4_ = 0xffffff92;
  local_50 = 0;
  *out_len = 0;
  ext_len = (size_t)buf;
  psStack_38 = out_len;
  out_len_local._4_4_ = uses_ec;
  puStack_28 = end;
  end_local = buf;
  buf_local = (uchar *)ssl;
  if (uses_ec != 0) {
    p._4_4_ = ssl_write_supported_point_formats_ext(ssl,buf,end,&local_50);
    if (p._4_4_ != 0) {
      mbedtls_debug_print_ret
                ((mbedtls_ssl_context *)buf_local,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x222,"ssl_write_supported_point_formats_ext",p._4_4_);
      return p._4_4_;
    }
    ext_len = local_50 + ext_len;
    p._4_4_ = 0;
  }
  p._4_4_ = ssl_write_ecjpake_kkpp_ext
                      ((mbedtls_ssl_context *)buf_local,(uchar *)ext_len,puStack_28,&local_50);
  if (p._4_4_ == 0) {
    ext_len = local_50 + ext_len;
    p._4_4_ = ssl_write_max_fragment_length_ext
                        ((mbedtls_ssl_context *)buf_local,(uchar *)ext_len,puStack_28,&local_50);
    if (p._4_4_ == 0) {
      *psStack_38 = (local_50 + ext_len) - (long)end_local;
      ssl_local._4_4_ = 0;
    }
    else {
      mbedtls_debug_print_ret
                ((mbedtls_ssl_context *)buf_local,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x23c,"ssl_write_max_fragment_length_ext",p._4_4_);
      ssl_local._4_4_ = p._4_4_;
    }
  }
  else {
    mbedtls_debug_print_ret
              ((mbedtls_ssl_context *)buf_local,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x22b,"ssl_write_ecjpake_kkpp_ext",p._4_4_);
    ssl_local._4_4_ = p._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_tls12_write_client_hello_exts(mbedtls_ssl_context *ssl,
                                              unsigned char *buf,
                                              const unsigned char *end,
                                              int uses_ec,
                                              size_t *out_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = buf;
    size_t ext_len = 0;

    (void) ssl;
    (void) end;
    (void) uses_ec;
    (void) ret;
    (void) ext_len;

    *out_len = 0;

    /* Note that TLS_EMPTY_RENEGOTIATION_INFO_SCSV is always added
     * even if MBEDTLS_SSL_RENEGOTIATION is not defined. */
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if ((ret = ssl_write_renegotiation_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_renegotiation_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_SOME_ECDH_OR_ECDHE_1_2_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDSA_CERT_REQ_ALLOWED_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if (uses_ec) {
        if ((ret = ssl_write_supported_point_formats_ext(ssl, p, end,
                                                         &ext_len)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_supported_point_formats_ext", ret);
            return ret;
        }
        p += ext_len;
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if ((ret = ssl_write_ecjpake_kkpp_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_ecjpake_kkpp_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
    if ((ret = ssl_write_cid_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_cid_ext", ret);
        return ret;
    }
    p += ext_len;
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    if ((ret = ssl_write_max_fragment_length_ext(ssl, p, end,
                                                 &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_max_fragment_length_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
    if ((ret = ssl_write_encrypt_then_mac_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_encrypt_then_mac_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
    if ((ret = ssl_write_extended_ms_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_extended_ms_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_DTLS_SRTP)
    if ((ret = ssl_write_use_srtp_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_use_srtp_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if ((ret = ssl_write_session_ticket_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_session_ticket_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

    *out_len = p - buf;

    return 0;
}